

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<kj::_::ArrayJoinPromiseNodeBase::Branch,kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::ExceptionOrValue&,kj::SourceLocation&>
               (Branch *location,ArrayJoinPromiseNodeBase *params,
               Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_1,ExceptionOrValue *params_2,
               SourceLocation *params_3)

{
  Branch *this;
  ArrayJoinPromiseNodeBase *joinNode;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  ExceptionOrValue *output;
  SourceLocation *pSVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  undefined1 local_32;
  SourceLocation *local_30;
  SourceLocation *params_local_3;
  ExceptionOrValue *params_local_2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local_1;
  ArrayJoinPromiseNodeBase *params_local;
  Branch *location_local;
  
  local_30 = params_3;
  params_local_3 = (SourceLocation *)params_2;
  params_local_2 = (ExceptionOrValue *)params_1;
  params_local_1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params;
  params_local = (ArrayJoinPromiseNodeBase *)location;
  this = (Branch *)operator_new(0x58);
  if (this != (Branch *)0x0) {
    local_32 = 1;
    joinNode = fwd<kj::_::ArrayJoinPromiseNodeBase&>((ArrayJoinPromiseNodeBase *)params_local_1);
    other = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                      ((NoInfer<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
                       params_local_2);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&local_40,other);
    output = fwd<kj::_::ExceptionOrValue&>((ExceptionOrValue *)params_local_3);
    pSVar1 = fwd<kj::SourceLocation&>(local_30);
    _::ArrayJoinPromiseNodeBase::Branch::Branch(this,joinNode,&local_40,output,*pSVar1);
  }
  local_32 = 0;
  if (this != (Branch *)0x0) {
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_40);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}